

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

int hexval(int c)

{
  undefined4 local_c;
  int c_local;
  
  if ((c < 0x30) || (0x39 < c)) {
    if ((c < 0x41) || (0x46 < c)) {
      if ((c < 0x61) || (0x66 < c)) {
        local_c = -1;
      }
      else {
        local_c = c + -0x57;
      }
    }
    else {
      local_c = c + -0x37;
    }
  }
  else {
    local_c = c + -0x30;
  }
  return local_c;
}

Assistant:

int hexval(int c)
{
    if (c >= '0' && c <= '9')
	return (c - '0');
    if (c >= 'A' && c <= 'F')
	return (c - 'A' + 10);
    if (c >= 'a' && c <= 'f')
	return (c - 'a' + 10);
    return (-1);
}